

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall helics::FilterFederate::organizeFilterOperations(FilterFederate *this)

{
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view type2;
  string_view type1;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference ppFVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  long in_RDI;
  reference rVar6;
  reference rVar7;
  reference rVar8;
  size_t ii_1;
  size_t ii;
  string currentType;
  bool firstPass;
  bool usedMore;
  bool someUnused;
  vector<bool,_std::allocator<bool>_> used;
  string endpointType;
  BasicHandleInfo *handle;
  FilterCoordinator *fedInfo;
  pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>
  *fc;
  iterator __end1;
  iterator __begin1;
  map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  HandleManager *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  InterfaceHandle in_stack_fffffffffffffe2c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe30;
  pointer in_stack_fffffffffffffe38;
  _Bit_type in_stack_fffffffffffffe40;
  _Bit_type *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  _Bit_type in_stack_fffffffffffffe58;
  _Bit_type *in_stack_fffffffffffffe60;
  pointer in_stack_fffffffffffffe68;
  byte local_171;
  reference local_130;
  basic_string_view<char,_std::char_traits<char>_> *local_120;
  reference local_118;
  __sv_type local_108;
  __sv_type local_f8;
  reference local_e8;
  reference local_d8;
  ulong local_c8;
  byte local_9d;
  byte local_9c;
  byte local_9b;
  allocator<bool> local_9a;
  undefined1 local_99;
  BaseType local_3c;
  BasicHandleInfo *local_38;
  pointer local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 0x2a0;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
       ::begin((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
                *)in_stack_fffffffffffffe18);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
       ::end((map<helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
              *)in_stack_fffffffffffffe18);
  rVar6._M_mask = in_stack_fffffffffffffe58;
  rVar6._M_p = in_stack_fffffffffffffe60;
  rVar7._M_mask = in_stack_fffffffffffffe40;
  rVar7._M_p = in_stack_fffffffffffffe48;
  while( true ) {
    bVar2 = std::operator==(&local_18,&local_20);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_28 = std::
               _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
                            *)0x5a14e4);
    local_30 = std::
               unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
               ::get((unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                      *)in_stack_fffffffffffffe20);
    local_3c = (local_28->first).hid;
    local_38 = HandleManager::getHandleInfo(in_stack_fffffffffffffe20,in_stack_fffffffffffffe2c);
    if (local_38 != (BasicHandleInfo *)0x0) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar6._M_p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar6._M_mask)
      ;
      bVar2 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::empty
                        ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                         in_stack_fffffffffffffe30);
      if (!bVar2) {
        std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::clear
                  ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)0x5a158b);
        std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                  (&local_30->allSourceFilters);
        std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::reserve
                  ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                   CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   (size_type)rVar7._M_p);
        std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                  (&local_30->allSourceFilters);
        local_99 = 0;
        std::allocator<bool>::allocator((allocator<bool> *)0x5a15e9);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)rVar7._M_mask,
                   (size_type)in_stack_fffffffffffffe38,(bool *)in_stack_fffffffffffffe30,
                   (allocator_type *)
                   CONCAT44(in_stack_fffffffffffffe2c.hid,in_stack_fffffffffffffe28));
        std::allocator<bool>::~allocator(&local_9a);
        local_9b = 1;
        local_9c = 1;
        local_9d = 1;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar6._M_p,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   rVar6._M_mask);
        while( true ) {
          local_171 = 0;
          if ((local_9b & 1) != 0) {
            local_171 = local_9c;
          }
          if ((local_171 & 1) == 0) break;
          local_9b = 0;
          local_9c = 0;
          local_c8 = 0;
          while( true ) {
            uVar1 = local_c8;
            sVar3 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                              (&local_30->allSourceFilters);
            if (sVar3 <= uVar1) break;
            rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)rVar7._M_mask,
                               (size_type)in_stack_fffffffffffffe38);
            local_d8 = rVar8;
            bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_d8);
            if (!bVar2) {
              if ((local_9d & 1) == 0) {
                std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::operator[]
                          (&local_30->allSourceFilters,local_c8);
                local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffe20);
                local_108 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffffe20);
                type1._M_str = (char *)in_stack_fffffffffffffe68;
                type1._M_len = (size_t)rVar6._M_p;
                type2._M_len._7_1_ = in_stack_fffffffffffffe57;
                type2._M_len._0_7_ = in_stack_fffffffffffffe50;
                type2._M_str = (char *)rVar6._M_mask;
                in_stack_fffffffffffffe57 = helics::core::matchingTypes(type1,type2);
                if ((bool)in_stack_fffffffffffffe57) {
                  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    ((vector<bool,_std::allocator<bool>_> *)rVar7._M_mask,
                                     (size_type)in_stack_fffffffffffffe38);
                  local_118 = rVar7;
                  std::_Bit_reference::operator=(&local_118,true);
                  local_9c = 1;
                  in_stack_fffffffffffffe38 = local_30;
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  operator[](&local_30->allSourceFilters,local_c8);
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  push_back((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                            in_stack_fffffffffffffe30,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffe2c.hid,in_stack_fffffffffffffe28));
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  operator[](&local_30->allSourceFilters,local_c8);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                }
                else {
                  local_9b = 1;
                }
              }
              else {
                ppFVar4 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                          operator[](&local_30->allSourceFilters,local_c8);
                if (((*ppFVar4)->cloning & 1U) == 0) {
                  local_9b = 1;
                }
                else {
                  in_stack_fffffffffffffe68 = local_30;
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  operator[](&local_30->allSourceFilters,local_c8);
                  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::
                  push_back((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                            in_stack_fffffffffffffe30,
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffffe2c.hid,in_stack_fffffffffffffe28));
                  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    ((vector<bool,_std::allocator<bool>_> *)rVar7._M_mask,
                                     (size_type)in_stack_fffffffffffffe38);
                  local_e8 = rVar6;
                  std::_Bit_reference::operator=(&local_e8,true);
                  local_9c = 1;
                }
              }
            }
            local_c8 = local_c8 + 1;
          }
          if ((local_9d & 1) != 0) {
            local_9d = 0;
            local_9c = 1;
          }
        }
        local_120 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
        while( true ) {
          in_stack_fffffffffffffe30 = local_120;
          pbVar5 = (basic_string_view<char,_std::char_traits<char>_> *)
                   std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::size
                             (&local_30->allSourceFilters);
          if (pbVar5 <= in_stack_fffffffffffffe30) break;
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)rVar7._M_mask,
                             (size_type)in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe20 = (HandleManager *)rVar8._M_mask;
          in_stack_fffffffffffffe28 = rVar8._M_p._0_4_;
          in_stack_fffffffffffffe2c.hid = rVar8._M_p._4_4_;
          local_130 = rVar8;
          bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_130);
          if (!bVar2) {
            in_stack_fffffffffffffe18 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (in_RDI + 0x370);
            std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::operator[]
                      (&local_30->allSourceFilters,(size_type)local_120);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe20);
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffe30,
                       (char *)CONCAT44(in_stack_fffffffffffffe2c.hid,in_stack_fffffffffffffe28));
            __args_1._M_str = (char *)rVar7._M_mask;
            __args_1._M_len = (size_t)in_stack_fffffffffffffe38;
            __args_2._M_len._4_4_ = in_stack_fffffffffffffe2c.hid;
            __args_2._M_len._0_4_ = in_stack_fffffffffffffe28;
            __args_2._M_str = (char *)in_stack_fffffffffffffe30;
            std::
            function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)in_stack_fffffffffffffe20,
                         (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),__args_1,__args_2);
          }
          local_120 = (basic_string_view<char,_std::char_traits<char>_> *)
                      ((long)&(((_Vector_base<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>
                                 *)&local_120->_M_len)->_M_impl).super__Vector_impl_data._M_start +
                      1);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe20);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x5a1b29);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe20);
    }
    std::
    _Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>
                  *)in_stack_fffffffffffffe20);
  }
  return;
}

Assistant:

void FilterFederate::organizeFilterOperations()
{
    for (auto& fc : filterCoord) {
        auto* fedInfo = fc.second.get();
        const auto* handle = mHandles->getHandleInfo(fc.first);
        if (handle == nullptr) {
            continue;
        }
        std::string endpointType = handle->type;

        if (!fedInfo->allSourceFilters.empty()) {
            fedInfo->sourceFilters.clear();
            fedInfo->sourceFilters.reserve(fedInfo->allSourceFilters.size());
            // Now we have to do some intelligent ordering with types
            std::vector<bool> used(fedInfo->allSourceFilters.size(), false);
            bool someUnused = true;
            bool usedMore = true;
            bool firstPass = true;
            std::string currentType = endpointType;
            while (someUnused && usedMore) {
                someUnused = false;
                usedMore = false;
                for (size_t ii = 0; ii < fedInfo->allSourceFilters.size(); ++ii) {
                    if (used[ii]) {
                        continue;
                    }
                    if (firstPass) {
                        if (fedInfo->allSourceFilters[ii]->cloning) {
                            fedInfo->sourceFilters.push_back(fedInfo->allSourceFilters[ii]);
                            used[ii] = true;
                            usedMore = true;
                        } else {
                            someUnused = true;
                        }
                    } else {
                        // TODO(PT): this will need some work to finish sorting out but should work
                        // for initial tests
                        if (core::matchingTypes(fedInfo->allSourceFilters[ii]->inputType,
                                                currentType)) {
                            used[ii] = true;
                            usedMore = true;
                            fedInfo->sourceFilters.push_back(fedInfo->allSourceFilters[ii]);
                            currentType = fedInfo->allSourceFilters[ii]->outputType;
                        } else {
                            someUnused = true;
                        }
                    }
                }
                if (firstPass) {
                    firstPass = false;
                    usedMore = true;
                }
            }
            for (size_t ii = 0; ii < fedInfo->allSourceFilters.size(); ++ii) {
                if (used[ii]) {
                    continue;
                }
                mLogger(HELICS_LOG_LEVEL_WARNING,
                        fedInfo->allSourceFilters[ii]->key,
                        "unable to match types on some filters");
            }
        }
    }
}